

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

void __thiscall GYMPlayer::RefreshTSRates(GYMPlayer *this)

{
  GYMPlayer *this_local;
  
  this->_ttMult = 1;
  this->_tsDiv = (ulong)this->_tickFreq;
  if (((this->_playOpts).genOpts.pbSpeed != 0) && ((this->_playOpts).genOpts.pbSpeed != 0x10000)) {
    this->_ttMult = this->_ttMult << 0x10;
    this->_tsDiv = (ulong)(this->_playOpts).genOpts.pbSpeed * this->_tsDiv;
  }
  this->_tsMult = this->_ttMult * (ulong)(this->super_PlayerBase)._outSmplRate;
  if ((this->_tsMult != this->_lastTsMult) || (this->_tsDiv != this->_lastTsDiv)) {
    if ((this->_lastTsMult != 0) && (this->_lastTsDiv != 0)) {
      this->_playSmpl =
           (UINT32)(((((ulong)this->_playSmpl * this->_lastTsDiv) / this->_lastTsMult) *
                    this->_tsMult) / this->_tsDiv);
    }
    this->_lastTsMult = this->_tsMult;
    this->_lastTsDiv = this->_tsDiv;
  }
  return;
}

Assistant:

void GYMPlayer::RefreshTSRates(void)
{
	_ttMult = 1;
	_tsDiv = _tickFreq;
	if (_playOpts.genOpts.pbSpeed != 0 && _playOpts.genOpts.pbSpeed != 0x10000)
	{
		_ttMult *= 0x10000;
		_tsDiv *= _playOpts.genOpts.pbSpeed;
	}
	_tsMult = _ttMult * _outSmplRate;
	if (_tsMult != _lastTsMult ||
	    _tsDiv != _lastTsDiv)
	{
		if (_lastTsMult && _lastTsDiv)	// the order * / * / is required to avoid overflow
			_playSmpl = (UINT32)(_playSmpl * _lastTsDiv / _lastTsMult * _tsMult / _tsDiv);
		_lastTsMult = _tsMult;
		_lastTsDiv = _tsDiv;
	}
	return;
}